

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetRootSetter
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  DescriptorFlags DVar3;
  undefined4 *puVar4;
  ScriptContext *requestContext_local;
  PropertyValueInfo *info_local;
  Var *setterValue_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  DictionaryTypeHandlerBase<int> *this_local;
  
  bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x27a,"(VarIs<RootObjectBase>(instance))",
                                "Instance must be a root object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  DVar3 = GetSetter_Internal<true>(this,instance,propertyId,setterValue,info,requestContext);
  return DVar3;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetRootSetter(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        AssertMsg(VarIs<RootObjectBase>(instance), "Instance must be a root object!");
        return GetSetter_Internal<true>(instance, propertyId, setterValue, info, requestContext);
    }